

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O0

string * __thiscall
flatbuffers::java::JavaGenerator::SourceCast_abi_cxx11_
          (string *__return_storage_ptr__,JavaGenerator *this,Type *type,bool castFromDest)

{
  bool bVar1;
  allocator<char> local_5f;
  allocator<char> local_5e;
  allocator<char> local_5d [20];
  allocator<char> local_49;
  Type local_48;
  byte local_21;
  Type *pTStack_20;
  bool castFromDest_local;
  Type *type_local;
  JavaGenerator *this_local;
  
  local_21 = castFromDest;
  pTStack_20 = type;
  type_local = (Type *)this;
  this_local = (JavaGenerator *)__return_storage_ptr__;
  bVar1 = IsSeries(type);
  if (bVar1) {
    Type::VectorType(&local_48,pTStack_20);
    SourceCast_abi_cxx11_(__return_storage_ptr__,this,&local_48,(bool)(local_21 & 1));
    return __return_storage_ptr__;
  }
  if ((local_21 & 1) != 0) {
    if (pTStack_20->base_type == BASE_TYPE_UINT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"(int) ",&local_49);
      std::allocator<char>::~allocator(&local_49);
      return __return_storage_ptr__;
    }
    if (pTStack_20->base_type == BASE_TYPE_USHORT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"(short) ",local_5d);
      std::allocator<char>::~allocator(local_5d);
      return __return_storage_ptr__;
    }
    if (pTStack_20->base_type == BASE_TYPE_UCHAR) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"(byte) ",&local_5e);
      std::allocator<char>::~allocator(&local_5e);
      return __return_storage_ptr__;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_5f);
  std::allocator<char>::~allocator(&local_5f);
  return __return_storage_ptr__;
}

Assistant:

std::string SourceCast(const Type &type, bool castFromDest) const {
    if (IsSeries(type)) {
      return SourceCast(type.VectorType(), castFromDest);
    } else {
      if (castFromDest) {
        if (type.base_type == BASE_TYPE_UINT)
          return "(int) ";
        else if (type.base_type == BASE_TYPE_USHORT)
          return "(short) ";
        else if (type.base_type == BASE_TYPE_UCHAR)
          return "(byte) ";
      }
    }
    return "";
  }